

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlParseSGMLCatalogPubid(xmlChar *cur,xmlChar **id)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  xmlChar *pxVar5;
  ulong uVar6;
  xmlChar *pxVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  *id = (xmlChar *)0x0;
  if (*cur == '\'') {
    bVar9 = 0x27;
LAB_00165cb3:
    cur = cur + 1;
    bVar2 = 1;
    bVar4 = false;
  }
  else {
    if (*cur == '\"') {
      bVar9 = 0x22;
      goto LAB_00165cb3;
    }
    bVar2 = 0;
    bVar9 = 0x20;
    bVar4 = true;
  }
  pxVar5 = (xmlChar *)(*xmlMalloc)(0x32);
  if (pxVar5 == (xmlChar *)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x14,
                        (xmlError *)0x0);
    return (xmlChar *)0x0;
  }
  bVar1 = *cur;
  uVar6 = (ulong)bVar1;
  if ((bool)(bVar9 == bVar1 & bVar2) || ""[uVar6] == '\0' && bVar1 != 0x3f) {
    uVar12 = 0;
  }
  else {
    uVar8 = 0x32;
    uVar12 = 0;
    while (((!bVar4 || (0x20 < (byte)uVar6)) || ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0))) {
      if ((int)uVar8 <= (int)uVar12 + 1) {
        uVar10 = 1;
        if ((0 < (int)uVar8) && (uVar10 = 0xffffffff, (int)uVar8 < 1000000000)) {
          uVar11 = uVar8 + 1 >> 1;
          uVar10 = uVar11 + uVar8;
          if ((int)(1000000000 - uVar11) < (int)uVar8) {
            uVar10 = 1000000000;
          }
        }
        if (((int)uVar10 < 0) ||
           (pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar5,(ulong)uVar10), pxVar7 == (xmlChar *)0x0)) {
          bVar3 = false;
          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x14,
                              (xmlError *)0x0);
          (*xmlFree)(pxVar5);
        }
        else {
          bVar3 = true;
          pxVar5 = pxVar7;
          uVar8 = uVar10;
        }
        if (!bVar3) {
          return (xmlChar *)0x0;
        }
      }
      pxVar5[uVar12] = cur[uVar12];
      bVar1 = cur[uVar12 + 1];
      uVar6 = (ulong)bVar1;
      uVar12 = uVar12 + 1;
      if ((bVar1 != 0x3f && ""[uVar6] == '\0') || ((bool)(bVar9 == bVar1 & bVar2))) break;
    }
    cur = cur + uVar12;
    uVar12 = uVar12 & 0xffffffff;
  }
  pxVar5[uVar12] = '\0';
  bVar2 = *cur;
  if (bVar4) {
    if ((bVar2 < 0x21) && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
LAB_00165e83:
      *id = pxVar5;
      return cur;
    }
  }
  else if (bVar9 == bVar2) {
    cur = cur + 1;
    goto LAB_00165e83;
  }
  (*xmlFree)(pxVar5);
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlParseSGMLCatalogPubid(const xmlChar *cur, xmlChar **id) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 50;
    xmlChar stop;

    *id = NULL;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	stop = ' ';
    }
    buf = xmlMalloc(size);
    if (buf == NULL) {
        xmlCatalogErrMemory();
	return(NULL);
    }
    while (IS_PUBIDCHAR_CH(*cur) || (*cur == '?')) {
	if ((*cur == stop) && (stop != ' '))
	    break;
	if ((stop == ' ') && (IS_BLANK_CH(*cur)))
	    break;
	if (len + 1 >= size) {
            xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, XML_MAX_ITEMS);
            if (newSize < 0) {
		xmlCatalogErrMemory();
		xmlFree(buf);
		return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlCatalogErrMemory();
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	buf[len++] = *cur;
	NEXT;
    }
    buf[len] = 0;
    if (stop == ' ') {
	if (!IS_BLANK_CH(*cur)) {
	    xmlFree(buf);
	    return(NULL);
	}
    } else {
	if (*cur != stop) {
	    xmlFree(buf);
	    return(NULL);
	}
	NEXT;
    }
    *id = buf;
    return(cur);
}